

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCanBeNull(Expr *p)

{
  bool bVar1;
  byte local_19;
  Expr *pEStack_18;
  u8 op;
  Expr *p_local;
  
  pEStack_18 = p;
  while( true ) {
    bVar1 = true;
    if (pEStack_18->op != 0x9d) {
      bVar1 = pEStack_18->op == 0x9c;
    }
    if (!bVar1) break;
    pEStack_18 = pEStack_18->pLeft;
  }
  local_19 = pEStack_18->op;
  if (local_19 == 0x84) {
    local_19 = pEStack_18->op2;
  }
  if ((local_19 == 0x5e) || (local_19 - 0x81 < 3)) {
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCanBeNull(const Expr *p){
  u8 op;
  while( p->op==TK_UPLUS || p->op==TK_UMINUS ){ p = p->pLeft; }
  op = p->op;
  if( op==TK_REGISTER ) op = p->op2;
  switch( op ){
    case TK_INTEGER:
    case TK_STRING:
    case TK_FLOAT:
    case TK_BLOB:
      return 0;
    default:
      return 1;
  }
}